

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

void __thiscall
vkt::tessellation::anon_unknown_0::InvariantOuterEdge::BaseTestInstance::uploadVertexAttributes
          (BaseTestInstance *this,vector<float,_std::allocator<float>_> *vertexData)

{
  Allocation *pAVar1;
  pointer __src;
  DeviceInterface *vkd;
  VkDevice device;
  
  vkd = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  pAVar1 = (this->m_vertexBuffer).m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  __src = (vertexData->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_start;
  memcpy(pAVar1->m_hostPtr,__src,
         (long)(vertexData->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)__src);
  ::vk::flushMappedMemoryRange
            (vkd,device,(VkDeviceMemory)(pAVar1->m_memory).m_internal,pAVar1->m_offset,
             (long)(vertexData->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(vertexData->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start);
  return;
}

Assistant:

void BaseTestInstance::uploadVertexAttributes (const std::vector<float>& vertexData)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	const Allocation& alloc = m_vertexBuffer.getAllocation();
	deMemcpy(alloc.getHostPtr(), &vertexData[0], sizeInBytes(vertexData));
	flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeInBytes(vertexData));
}